

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

ValidateXrFlagsResult ValidateXrEnvironmentDepthProviderCreateFlagsMETA(XrFlags64 value)

{
  return (ValidateXrFlagsResult)(value != 0);
}

Assistant:

ValidateXrFlagsResult ValidateXrEnvironmentDepthProviderCreateFlagsMETA(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}